

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

int Kit_TruthVarInSupport(uint *pTruth,int nVars,int iVar)

{
  uint *puVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  uVar5 = 1;
  uVar8 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar8 = uVar5;
  }
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar8 == uVar7) {
          return 0;
        }
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while (((*puVar1 >> 1 ^ *puVar1) & 0x55555555) == 0);
      break;
    case 1:
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar8 == uVar7) {
          return 0;
        }
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while (((*puVar1 >> 2 ^ *puVar1) & 0x33333333) == 0);
      break;
    case 2:
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar8 == uVar7) {
          return 0;
        }
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while (((*puVar1 >> 4 ^ *puVar1) & 0xf0f0f0f) == 0);
      break;
    case 3:
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar8 == uVar7) {
          return 0;
        }
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while (((*puVar1 >> 8 ^ *puVar1) & 0xff00ff) == 0);
      break;
    case 4:
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar8 == uVar7) {
          return 0;
        }
        puVar1 = pTruth + uVar7;
        uVar7 = uVar7 + 1;
      } while ((*puVar1 & 0xffff) == *puVar1 >> 0x10);
      break;
    default:
      bVar6 = (char)iVar - 5;
      bVar2 = bVar6 & 0x1f;
      uVar4 = 1 << bVar2;
      iVar9 = 2 << (bVar6 & 0x1f);
      uVar5 = 0 << bVar2;
      uVar7 = 0;
      if (0 < (int)uVar4) {
        uVar7 = (ulong)uVar4;
      }
      for (iVar10 = 0; iVar10 < (int)uVar8; iVar10 = iVar10 + iVar9) {
        uVar11 = 0;
        while (uVar7 != uVar11) {
          puVar1 = pTruth + uVar11;
          lVar3 = (long)(int)uVar4 + uVar11;
          uVar11 = uVar11 + 1;
          if (*puVar1 != pTruth[lVar3]) {
            return 1;
          }
        }
        pTruth = pTruth + iVar9;
      }
    }
    return uVar5;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                ,0x113,"int Kit_TruthVarInSupport(unsigned int *, int, int)");
}

Assistant:

int Kit_TruthVarInSupport( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x55555555) != ((pTruth[i] & 0xAAAAAAAA) >> 1) )
                return 1;
        return 0;
    case 1:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x33333333) != ((pTruth[i] & 0xCCCCCCCC) >> 2) )
                return 1;
        return 0;
    case 2:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x0F0F0F0F) != ((pTruth[i] & 0xF0F0F0F0) >> 4) )
                return 1;
        return 0;
    case 3:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x00FF00FF) != ((pTruth[i] & 0xFF00FF00) >> 8) )
                return 1;
        return 0;
    case 4:
        for ( i = 0; i < nWords; i++ )
            if ( (pTruth[i] & 0x0000FFFF) != ((pTruth[i] & 0xFFFF0000) >> 16) )
                return 1;
        return 0;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                if ( pTruth[i] != pTruth[Step+i] )
                    return 1;
            pTruth += 2*Step;
        }
        return 0;
    }
}